

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.h
# Opt level: O0

bool __thiscall
libebml::EbmlSemanticContext::operator!=(EbmlSemanticContext *this,EbmlSemanticContext *aElt)

{
  bool local_19;
  EbmlSemanticContext *aElt_local;
  EbmlSemanticContext *this_local;
  
  local_19 = true;
  if (((this->Size == aElt->Size) && (local_19 = true, this->MyTable == aElt->MyTable)) &&
     (local_19 = true, this->UpTable == aElt->UpTable)) {
    local_19 = this->GetGlobalContext != aElt->GetGlobalContext ||
               this->MasterElt != aElt->MasterElt;
  }
  return local_19;
}

Assistant:

bool operator!=(const EbmlSemanticContext & aElt) const {
      return ((Size != aElt.Size) || (MyTable != aElt.MyTable) ||
        (UpTable != aElt.UpTable) || (GetGlobalContext != aElt.GetGlobalContext) |
        (MasterElt != aElt.MasterElt));
    }